

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

decNumber * uprv_decNumberFromString_63(decNumber *dn,char *chars,decContext *set)

{
  byte bVar1;
  uint uVar2;
  uint32_t status;
  long lVar3;
  uint8_t *lsu;
  uint8_t *puVar4;
  byte *pbVar5;
  uint len;
  byte bVar6;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  byte bVar11;
  byte *pbVar12;
  byte *pbVar13;
  int iVar14;
  uint8_t *buffer;
  bool bVar15;
  int32_t residue;
  uint8_t resbuff [45];
  uint32_t local_74;
  int local_70;
  int32_t local_6c;
  uint8_t local_68 [56];
  
  lVar3 = 0;
  len = 0;
  pbVar5 = (byte *)0x0;
  pbVar13 = (byte *)0x0;
  bVar1 = 0;
  pbVar12 = (byte *)chars;
LAB_00243b3b:
  pbVar8 = (byte *)(chars + lVar3);
  bVar11 = chars[lVar3];
  if ((byte)(bVar11 - 0x30) < 10) {
    len = len + 1;
    pbVar13 = pbVar8;
LAB_00243b98:
    lVar3 = lVar3 + 1;
    goto LAB_00243b3b;
  }
  if (pbVar5 == (byte *)0x0 && bVar11 == 0x2e) {
    pbVar12 = pbVar12 + (pbVar8 == pbVar12);
    pbVar5 = pbVar8;
    goto LAB_00243b98;
  }
  if (lVar3 == 0) {
    if (bVar11 == 0x2b) {
      pbVar12 = pbVar12 + 1;
    }
    else {
      if (bVar11 != 0x2d) goto LAB_00243ba3;
      pbVar12 = pbVar12 + 1;
      bVar1 = 0x80;
    }
    goto LAB_00243b98;
  }
  chars = chars + lVar3;
LAB_00243ba3:
  if (pbVar13 == (byte *)0x0) {
    local_74 = 1;
    status = 1;
    if (pbVar5 == (byte *)0x0 && bVar11 != 0) {
      dn->bits = '\0';
      dn->lsu[0] = '\0';
      dn->digits = 1;
      dn->exponent = 0;
      lVar3 = 0;
      while( true ) {
        bVar11 = ((byte *)chars)[lVar3];
        if ((bVar11 != "infinity"[lVar3]) && (bVar11 != "INFINITY"[lVar3])) {
          lVar3 = 0;
          goto LAB_00243e7f;
        }
        if (bVar11 == 0) break;
        lVar3 = lVar3 + 1;
      }
LAB_00243e99:
      dn->bits = bVar1 | 0x40;
      return dn;
    }
    goto LAB_00243e60;
  }
  if (bVar11 == 0) {
    iVar7 = 0;
LAB_00243d07:
    local_74 = 0;
    pbVar8 = pbVar12;
    if ((*pbVar12 == 0x30) && (pbVar12 < pbVar13)) {
      lVar3 = (long)pbVar13 - (long)pbVar12;
      do {
        if (*pbVar12 != 0x2e) {
          pbVar8 = pbVar12;
          if (*pbVar12 != 0x30) break;
          len = len - 1;
        }
        pbVar12 = pbVar12 + 1;
        lVar3 = lVar3 + -1;
        pbVar8 = pbVar13;
      } while (lVar3 != 0);
    }
    iVar14 = (int)pbVar5 - (int)pbVar13;
    if (pbVar13 <= pbVar5) {
      iVar14 = 0;
    }
    if (pbVar5 == (byte *)0x0) {
      iVar14 = 0;
    }
    if (set->digits < (int)len) {
      uVar2 = len;
      local_70 = iVar7;
      if ((int)len < 0x32) {
        if (3 < (long)(int)len - 0x2eU) {
          lsu = local_68;
          buffer = (uint8_t *)0x0;
          goto LAB_00243dae;
        }
        uVar2 = (uint)""[(int)len];
      }
      lsu = (uint8_t *)uprv_malloc_63((ulong)uVar2);
      buffer = lsu;
      iVar7 = local_70;
      if (lsu == (uint8_t *)0x0) {
        status = 0x10;
        goto LAB_00243e60;
      }
    }
    else {
      lsu = dn->lsu;
      buffer = (uint8_t *)0x0;
    }
LAB_00243dae:
    iVar14 = iVar14 + iVar7;
    puVar4 = lsu;
    for (; pbVar8 <= pbVar13; pbVar13 = pbVar13 + -1) {
      if (*pbVar13 != 0x2e) {
        *puVar4 = *pbVar13 - 0x30;
        puVar4 = puVar4 + 1;
      }
    }
    dn->bits = bVar1;
    dn->exponent = iVar14;
    dn->digits = len;
    if (set->digits < (int)len) {
      local_6c = 0;
      decSetCoeff(dn,set,lsu,len,&local_6c,&local_74);
LAB_00243e2a:
      decFinalize(dn,set,&local_6c,&local_74);
    }
    else if ((iVar14 <= (int)(set->emin - len)) || (set->emax - set->digits < iVar14 + -1)) {
      local_6c = 0;
      goto LAB_00243e2a;
    }
    if (buffer != (uint8_t *)0x0) {
      uprv_free_63(buffer);
    }
  }
  else {
    local_74 = 1;
    if ((bVar11 | 0x20) != 0x65) {
      status = 1;
      goto LAB_00243e60;
    }
    bVar15 = (((byte *)chars)[1] - 0x2b & 0xfd) == 0;
    pbVar8 = (byte *)chars + 1;
    if (bVar15) {
      pbVar8 = (byte *)chars + 2;
    }
    bVar11 = ((byte *)chars)[(ulong)bVar15 + 1];
    if (((byte *)chars)[(ulong)bVar15 + 1] != 0) {
      do {
        bVar6 = bVar11;
        pbVar9 = pbVar8;
        pbVar8 = pbVar9 + 1;
        if (bVar6 != 0x30) break;
        bVar11 = *pbVar8;
      } while (*pbVar8 != 0);
      bVar11 = *pbVar9;
      if ((byte)(bVar11 - 0x3a) < 0xf6) {
        uVar10 = 0;
        iVar7 = 0;
      }
      else {
        iVar7 = 0;
        uVar10 = 0;
        do {
          iVar7 = (uint)bVar11 + iVar7 * 10 + -0x30;
          bVar11 = pbVar8[uVar10];
          uVar10 = uVar10 + 1;
        } while (0xf5 < (byte)(bVar11 - 0x3a));
      }
      if (bVar11 == 0) {
        iVar14 = iVar7;
        if (uVar10 != 10) {
          iVar14 = 0x773593fe;
        }
        if ('1' < (char)bVar6) {
          iVar14 = 0x773593fe;
        }
        if (uVar10 < 10) {
          iVar14 = iVar7;
        }
        iVar7 = -iVar14;
        if (((byte *)chars)[1] != 0x2d) {
          iVar7 = iVar14;
        }
        goto LAB_00243d07;
      }
    }
  }
LAB_00243e58:
  status = local_74;
  if (local_74 == 0) {
    return dn;
  }
LAB_00243e60:
  decStatus(dn,status,set);
  return dn;
LAB_00243e7f:
  bVar11 = ((byte *)chars)[lVar3];
  if ((bVar11 != "inf"[lVar3]) && (bVar11 != "INF"[lVar3])) {
    bVar6 = bVar1 | 0x20;
    dn->bits = bVar6;
    bVar11 = *chars;
    if ((bVar11 | 0x20) == 0x73) {
      bVar6 = bVar1 | 0x10;
      dn->bits = bVar6;
      bVar11 = ((byte *)chars)[1];
      chars = (char *)((byte *)chars + 1);
    }
    if ((((bVar11 | 0x20) == 0x6e) && ((((byte *)chars)[1] | 0x20) == 0x61)) &&
       ((((byte *)chars)[2] | 0x20) == 0x6e)) {
      for (pbVar12 = (byte *)chars + 3; bVar1 = *pbVar12, bVar1 == 0x30; pbVar12 = pbVar12 + 1) {
      }
      if (bVar1 == 0) {
        return dn;
      }
      if ((byte)(bVar1 - 0x3a) < 0xf6) {
        pbVar13 = (byte *)0x0;
      }
      else {
        pbVar13 = pbVar12 + -1;
        do {
          len = len + 1;
          bVar1 = pbVar13[2];
          pbVar13 = pbVar13 + 1;
        } while (0xf5 < (byte)(bVar1 - 0x3a));
      }
      if ((bVar1 == 0) &&
         (((int)len < set->digits || ((set->clamp == '\0' && ((int)len <= set->digits)))))) {
        iVar7 = 0;
        bVar1 = bVar6;
        goto LAB_00243d07;
      }
    }
    goto LAB_00243e58;
  }
  if (bVar11 != 0) goto code_r0x00243e94;
  goto LAB_00243e99;
code_r0x00243e94:
  lVar3 = lVar3 + 1;
  goto LAB_00243e7f;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberFromString(decNumber *dn, const char chars[],
                                decContext *set) {
  Int   exponent=0;                /* working exponent [assume 0]  */
  uByte bits=0;                    /* working flags [assume +ve]  */
  Unit  *res;                      /* where result will be built  */
  Unit  resbuff[SD2U(DECBUFFER+9)];/* local buffer in case need temporary  */
                                   /* [+9 allows for ln() constants]  */
  Unit  *allocres=NULL;            /* -> allocated result, iff allocated  */
  Int   d=0;                       /* count of digits found in decimal part  */
  const char *dotchar=NULL;        /* where dot was found  */
  const char *cfirst=chars;        /* -> first character of decimal part  */
  const char *last=NULL;           /* -> last digit of decimal part  */
  const char *c;                   /* work  */
  Unit  *up;                       /* ..  */
  #if DECDPUN>1
  Int   cut, out;                  /* ..  */
  #endif
  Int   residue;                   /* rounding residue  */
  uInt  status=0;                  /* error code  */

  #if DECCHECK
  if (decCheckOperands(DECUNRESU, DECUNUSED, DECUNUSED, set))
    return uprv_decNumberZero(dn);
  #endif

  do {                             /* status & malloc protection  */
    for (c=chars;; c++) {          /* -> input character  */
      if (*c>='0' && *c<='9') {    /* test for Arabic digit  */
        last=c;
        d++;                       /* count of real digits  */
        continue;                  /* still in decimal part  */
        }
      if (*c=='.' && dotchar==NULL) { /* first '.'  */
        dotchar=c;                 /* record offset into decimal part  */
        if (c==cfirst) cfirst++;   /* first digit must follow  */
        continue;}
      if (c==chars) {              /* first in string...  */
        if (*c=='-') {             /* valid - sign  */
          cfirst++;
          bits=DECNEG;
          continue;}
        if (*c=='+') {             /* valid + sign  */
          cfirst++;
          continue;}
        }
      /* *c is not a digit, or a valid +, -, or '.'  */
      break;
      } /* c  */

    if (last==NULL) {              /* no digits yet  */
      status=DEC_Conversion_syntax;/* assume the worst  */
      if (*c=='\0') break;         /* and no more to come...  */
      #if DECSUBSET
      /* if subset then infinities and NaNs are not allowed  */
      if (!set->extended) break;   /* hopeless  */
      #endif
      /* Infinities and NaNs are possible, here  */
      if (dotchar!=NULL) break;    /* .. unless had a dot  */
      uprv_decNumberZero(dn);           /* be optimistic  */
      if (decBiStr(c, "infinity", "INFINITY")
       || decBiStr(c, "inf", "INF")) {
        dn->bits=bits | DECINF;
        status=0;                  /* is OK  */
        break; /* all done  */
        }
      /* a NaN expected  */
      /* 2003.09.10 NaNs are now permitted to have a sign  */
      dn->bits=bits | DECNAN;      /* assume simple NaN  */
      if (*c=='s' || *c=='S') {    /* looks like an sNaN  */
        c++;
        dn->bits=bits | DECSNAN;
        }
      if (*c!='n' && *c!='N') break;    /* check caseless "NaN"  */
      c++;
      if (*c!='a' && *c!='A') break;    /* ..  */
      c++;
      if (*c!='n' && *c!='N') break;    /* ..  */
      c++;
      /* now either nothing, or nnnn payload, expected  */
      /* -> start of integer and skip leading 0s [including plain 0]  */
      for (cfirst=c; *cfirst=='0';) cfirst++;
      if (*cfirst=='\0') {         /* "NaN" or "sNaN", maybe with all 0s  */
        status=0;                  /* it's good  */
        break;                     /* ..  */
        }
      /* something other than 0s; setup last and d as usual [no dots]  */
      for (c=cfirst;; c++, d++) {
        if (*c<'0' || *c>'9') break; /* test for Arabic digit  */
        last=c;
        }
      if (*c!='\0') break;         /* not all digits  */
      if (d>set->digits-1) {
        /* [NB: payload in a decNumber can be full length unless  */
        /* clamped, in which case can only be digits-1]  */
        if (set->clamp) break;
        if (d>set->digits) break;
        } /* too many digits?  */
      /* good; drop through to convert the integer to coefficient  */
      status=0;                    /* syntax is OK  */
      bits=dn->bits;               /* for copy-back  */
      } /* last==NULL  */

     else if (*c!='\0') {          /* more to process...  */
      /* had some digits; exponent is only valid sequence now  */
      Flag nege;                   /* 1=negative exponent  */
      const char *firstexp;        /* -> first significant exponent digit  */
      status=DEC_Conversion_syntax;/* assume the worst  */
      if (*c!='e' && *c!='E') break;
      /* Found 'e' or 'E' -- now process explicit exponent */
      /* 1998.07.11: sign no longer required  */
      nege=0;
      c++;                         /* to (possible) sign  */
      if (*c=='-') {nege=1; c++;}
       else if (*c=='+') c++;
      if (*c=='\0') break;

      for (; *c=='0' && *(c+1)!='\0';) c++;  /* strip insignificant zeros  */
      firstexp=c;                            /* save exponent digit place  */
      uInt uexponent = 0;   /* Avoid undefined behavior on signed int overflow */
      for (; ;c++) {
        if (*c<'0' || *c>'9') break;         /* not a digit  */
        uexponent=X10(uexponent)+(uInt)*c-(uInt)'0';
        } /* c  */
      exponent = (Int)uexponent;
      /* if not now on a '\0', *c must not be a digit  */
      if (*c!='\0') break;

      /* (this next test must be after the syntax checks)  */
      /* if it was too long the exponent may have wrapped, so check  */
      /* carefully and set it to a certain overflow if wrap possible  */
      if (c>=firstexp+9+1) {
        if (c>firstexp+9+1 || *firstexp>'1') exponent=DECNUMMAXE*2;
        /* [up to 1999999999 is OK, for example 1E-1000000998]  */
        }
      if (nege) exponent=-exponent;     /* was negative  */
      status=0;                         /* is OK  */
      } /* stuff after digits  */

    /* Here when whole string has been inspected; syntax is good  */
    /* cfirst->first digit (never dot), last->last digit (ditto)  */

    /* strip leading zeros/dot [leave final 0 if all 0's]  */
    if (*cfirst=='0') {                 /* [cfirst has stepped over .]  */
      for (c=cfirst; c<last; c++, cfirst++) {
        if (*c=='.') continue;          /* ignore dots  */
        if (*c!='0') break;             /* non-zero found  */
        d--;                            /* 0 stripped  */
        } /* c  */
      #if DECSUBSET
      /* make a rapid exit for easy zeros if !extended  */
      if (*cfirst=='0' && !set->extended) {
        uprv_decNumberZero(dn);              /* clean result  */
        break;                          /* [could be return]  */
        }
      #endif
      } /* at least one leading 0  */

    /* Handle decimal point...  */
    if (dotchar!=NULL && dotchar<last)  /* non-trailing '.' found?  */
      exponent -= static_cast<int32_t>(last-dotchar);         /* adjust exponent  */
    /* [we can now ignore the .]  */

    /* OK, the digits string is good.  Assemble in the decNumber, or in  */
    /* a temporary units array if rounding is needed  */
    if (d<=set->digits) res=dn->lsu;    /* fits into supplied decNumber  */
     else {                             /* rounding needed  */
      Int needbytes=D2U(d)*sizeof(Unit);/* bytes needed  */
      res=resbuff;                      /* assume use local buffer  */
      if (needbytes>(Int)sizeof(resbuff)) { /* too big for local  */
        allocres=(Unit *)malloc(needbytes);
        if (allocres==NULL) {status|=DEC_Insufficient_storage; break;}
        res=allocres;
        }
      }
    /* res now -> number lsu, buffer, or allocated storage for Unit array  */

    /* Place the coefficient into the selected Unit array  */
    /* [this is often 70% of the cost of this function when DECDPUN>1]  */
    #if DECDPUN>1
    out=0;                         /* accumulator  */
    up=res+D2U(d)-1;               /* -> msu  */
    cut=d-(up-res)*DECDPUN;        /* digits in top unit  */
    for (c=cfirst;; c++) {         /* along the digits  */
      if (*c=='.') continue;       /* ignore '.' [don't decrement cut]  */
      out=X10(out)+(Int)*c-(Int)'0';
      if (c==last) break;          /* done [never get to trailing '.']  */
      cut--;
      if (cut>0) continue;         /* more for this unit  */
      *up=(Unit)out;               /* write unit  */
      up--;                        /* prepare for unit below..  */
      cut=DECDPUN;                 /* ..  */
      out=0;                       /* ..  */
      } /* c  */
    *up=(Unit)out;                 /* write lsu  */

    #else
    /* DECDPUN==1  */
    up=res;                        /* -> lsu  */
    for (c=last; c>=cfirst; c--) { /* over each character, from least  */
      if (*c=='.') continue;       /* ignore . [don't step up]  */
      *up=(Unit)((Int)*c-(Int)'0');
      up++;
      } /* c  */
    #endif

    dn->bits=bits;
    dn->exponent=exponent;
    dn->digits=d;

    /* if not in number (too long) shorten into the number  */
    if (d>set->digits) {
      residue=0;
      decSetCoeff(dn, set, res, d, &residue, &status);
      /* always check for overflow or subnormal and round as needed  */
      decFinalize(dn, set, &residue, &status);
      }
     else { /* no rounding, but may still have overflow or subnormal  */
      /* [these tests are just for performance; finalize repeats them]  */
      if ((dn->exponent-1<set->emin-dn->digits)
       || (dn->exponent-1>set->emax-set->digits)) {
        residue=0;
        decFinalize(dn, set, &residue, &status);
        }
      }
    /* decNumberShow(dn);  */
    } while(0);                         /* [for break]  */

  if (allocres!=NULL) free(allocres);   /* drop any storage used  */
  if (status!=0) decStatus(dn, status, set);
  return dn;
  }